

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O3

void __thiscall VDasher::dashHelper(VDasher *this,VPath *path,VPath *result)

{
  Element EVar1;
  model *pmVar2;
  pointer pVVar3;
  pointer pEVar4;
  VPathData *this_00;
  size_t in_RCX;
  pointer pVVar5;
  Element *i;
  pointer pEVar6;
  
  this->mResult = result;
  pmVar2 = (path->d).mModel;
  pVVar5 = (pmVar2->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar3 = (pmVar2->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar6 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&result->d,(int)path,result,in_RCX);
  VPath::VPathData::reserve(this_00,(long)pVVar5 - (long)pVVar3 >> 3,(long)pEVar6 - (long)pEVar4);
  this->mIndex = 0;
  pmVar2 = (path->d).mModel;
  pEVar6 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar4) {
    pVVar5 = (pmVar2->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      EVar1 = *pEVar6;
      if (EVar1 == CubicTo) {
        cubicTo(this,pVVar5,pVVar5 + 1,pVVar5 + 2);
        pVVar5 = pVVar5 + 3;
      }
      else {
        if (EVar1 == LineTo) {
          lineTo(this,pVVar5);
        }
        else {
          if (EVar1 != MoveTo) goto LAB_0010d116;
          moveTo(this,pVVar5);
        }
        pVVar5 = pVVar5 + 1;
      }
LAB_0010d116:
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar4);
  }
  this->mResult = (VPath *)0x0;
  return;
}

Assistant:

void VDasher::dashHelper(const VPath &path, VPath &result)
{
    mResult = &result;
    mResult->reserve(path.points().size(), path.elements().size());
    mIndex = 0;
    const std::vector<VPath::Element> &elms = path.elements();
    const std::vector<VPointF> &       pts = path.points();
    const VPointF *                    ptPtr = pts.data();

    for (auto &i : elms) {
        switch (i) {
        case VPath::Element::MoveTo: {
            moveTo(*ptPtr++);
            break;
        }
        case VPath::Element::LineTo: {
            lineTo(*ptPtr++);
            break;
        }
        case VPath::Element::CubicTo: {
            cubicTo(*ptPtr, *(ptPtr + 1), *(ptPtr + 2));
            ptPtr += 3;
            break;
        }
        case VPath::Element::Close: {
            // The point is already joined to start point in VPath
            // no need to do anything here.
            break;
        }
        }
    }
    mResult = nullptr;
}